

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall mp::NameProvider::get_names_abi_cxx11_(NameProvider *this,size_t n,size_t i2)

{
  ulong in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  StringRef SVar1;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  size_type in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  BasicStringRef<char> *in_stack_ffffffffffffffa8;
  ulong i2_00;
  size_t in_stack_ffffffffffffffc8;
  NameProvider *in_stack_ffffffffffffffd0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x567c78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (i2_00 = 0; i2_00 < in_RDX; i2_00 = i2_00 + 1) {
    SVar1 = name(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,i2_00);
    fmt::BasicStringRef::operator_cast_to_string(in_stack_ffffffffffffffa8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)SVar1.data_,(value_type *)SVar1.size_);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> mp::NameProvider::get_names(
    size_t n, size_t i2) {
  std::vector<std::string> result;
  result.reserve(n);
  for (size_t i=0; i<n; ++i)
    result.push_back(name(i, i2));
  return result;
}